

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

void re2::Regexp::RemoveLeadingString(Regexp *re,int n)

{
  uint8 uVar1;
  ushort uVar2;
  int iVar3;
  Regexp *this;
  Regexp *that;
  int iVar4;
  long lVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  uint uVar7;
  ulong uVar8;
  Regexp *stk [4];
  long alStack_1e8 [7];
  LogMessage local_1b0;
  
  uVar7 = 0;
  while( true ) {
    uVar1 = re->op_;
    if (uVar1 != '\x05') break;
    if ((int)uVar7 < 4) {
      lVar5 = (long)(int)uVar7;
      uVar7 = uVar7 + 1;
      alStack_1e8[lVar5 + 2] = (long)re;
    }
    if (re->nsub_ < 2) {
      paVar6 = &re->field_5;
    }
    else {
      paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    re = paVar6->subone_;
  }
  if (uVar1 != '\x03') {
    if (uVar1 != '\x04') goto LAB_001101f6;
    iVar3 = (re->field_7).field_0.max_;
    iVar4 = iVar3 - n;
    if (iVar4 != 0 && n <= iVar3) {
      if (iVar3 + -1 == n) {
        iVar3 = *(int *)((long)(re->field_7).the_union_[1] + (long)n * 4);
        alStack_1e8[1] = 0x1101c5;
        operator_delete__((re->field_7).the_union_[1]);
        (re->field_7).field_1.name_ = (string *)0x0;
        (re->field_7).field_0.max_ = iVar3;
        re->op_ = '\x03';
      }
      else {
        (re->field_7).field_0.max_ = iVar4;
        alStack_1e8[1] = 0x110323;
        memmove((re->field_7).the_union_[1],
                (void *)((long)(re->field_7).the_union_[1] + (long)n * 4),(long)iVar4 << 2);
      }
      goto LAB_001101f6;
    }
    if ((re->field_7).the_union_[1] != (void *)0x0) {
      alStack_1e8[1] = 0x1101e4;
      operator_delete__((re->field_7).the_union_[1]);
    }
    (re->field_7).field_1.name_ = (string *)0x0;
  }
  (re->field_7).field_0.max_ = 0;
  re->op_ = '\x02';
LAB_001101f6:
  if (0 < (int)uVar7) {
    uVar8 = (ulong)uVar7 + 1;
    do {
      this = (Regexp *)alStack_1e8[uVar8];
      if (this->nsub_ < 2) {
        paVar6 = &this->field_5;
      }
      else {
        paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      if (paVar6->subone_->op_ == '\x02') {
        alStack_1e8[1] = 0x11023e;
        Decref(paVar6->subone_);
        paVar6->submany_ = (Regexp **)0x0;
        uVar2 = this->nsub_;
        if (uVar2 < 2) {
          alStack_1e8[1] = 0x110265;
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc"
                     ,0x327,3);
          alStack_1e8[1] = 0x110279;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"Concat of ",10);
          alStack_1e8[1] = 0x110286;
          std::ostream::operator<<((ostream *)&local_1b0.str_,(uint)this->nsub_);
          alStack_1e8[1] = 0x11028e;
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
          (this->field_5).submany_ = (Regexp **)0x0;
          this->op_ = '\x02';
        }
        else if (uVar2 == 2) {
          that = paVar6[1].subone_;
          paVar6[1].submany_ = (Regexp **)0x0;
          alStack_1e8[1] = 0x1102bc;
          Swap(this,that);
          alStack_1e8[1] = 0x1102cf;
          Decref(that);
        }
        else {
          this->nsub_ = uVar2 - 1;
          alStack_1e8[1] = 0x1102ea;
          memmove(paVar6,paVar6 + 1,(ulong)(ushort)(uVar2 - 1) << 3);
        }
      }
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  return;
}

Assistant:

void Regexp::RemoveLeadingString(Regexp* re, int n) {
  // Chase down concats to find first string.
  // For regexps generated by parser, nested concats are
  // flattened except when doing so would overflow the 16-bit
  // limit on the size of a concatenation, so we should never
  // see more than two here.
  Regexp* stk[4];
  int d = 0;
  while (re->op() == kRegexpConcat) {
    if (d < arraysize(stk))
      stk[d++] = re;
    re = re->sub()[0];
  }

  // Remove leading string from re.
  if (re->op() == kRegexpLiteral) {
    re->rune_ = 0;
    re->op_ = kRegexpEmptyMatch;
  } else if (re->op() == kRegexpLiteralString) {
    if (n >= re->nrunes_) {
      delete[] re->runes_;
      re->runes_ = NULL;
      re->nrunes_ = 0;
      re->op_ = kRegexpEmptyMatch;
    } else if (n == re->nrunes_ - 1) {
      Rune rune = re->runes_[re->nrunes_ - 1];
      delete[] re->runes_;
      re->runes_ = NULL;
      re->nrunes_ = 0;
      re->rune_ = rune;
      re->op_ = kRegexpLiteral;
    } else {
      re->nrunes_ -= n;
      memmove(re->runes_, re->runes_ + n, re->nrunes_ * sizeof re->runes_[0]);
    }
  }

  // If re is now empty, concatenations might simplify too.
  while (d-- > 0) {
    re = stk[d];
    Regexp** sub = re->sub();
    if (sub[0]->op() == kRegexpEmptyMatch) {
      sub[0]->Decref();
      sub[0] = NULL;
      // Delete first element of concat.
      switch (re->nsub()) {
        case 0:
        case 1:
          // Impossible.
          LOG(DFATAL) << "Concat of " << re->nsub();
          re->submany_ = NULL;
          re->op_ = kRegexpEmptyMatch;
          break;

        case 2: {
          // Replace re with sub[1].
          Regexp* old = sub[1];
          sub[1] = NULL;
          re->Swap(old);
          old->Decref();
          break;
        }

        default:
          // Slide down.
          re->nsub_--;
          memmove(sub, sub + 1, re->nsub_ * sizeof sub[0]);
          break;
      }
    }
  }
}